

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraHot.c
# Opt level: O1

void Fra_OneHotCheck(Fra_Man_t *p,Vec_Int_t *vOneHots)

{
  uint uVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  long lVar9;
  
  iVar6 = vOneHots->nSize;
  if (0 < iVar6) {
    iVar7 = p->pManFraig->nObjs[3] - p->pManFraig->nRegs;
    lVar9 = 0;
    do {
      if ((long)iVar6 <= lVar9 + 1) goto LAB_005cc101;
      uVar1 = vOneHots->pArray[lVar9];
      uVar2 = vOneHots->pArray[lVar9 + 1];
      if (uVar1 != 0 || uVar2 != 0) {
        uVar5 = ~uVar1;
        if (0 < (int)uVar1) {
          uVar5 = uVar1 - 1;
        }
        uVar5 = uVar5 + iVar7;
        if ((int)uVar5 < 0) {
LAB_005cc0e2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pVVar3 = p->pManFraig->vCos;
        iVar6 = pVVar3->nSize;
        if (iVar6 <= (int)uVar5) goto LAB_005cc0e2;
        uVar8 = ~uVar2;
        if (0 < (int)uVar2) {
          uVar8 = uVar2 - 1;
        }
        uVar8 = uVar8 + iVar7;
        if (((int)uVar8 < 0) || (iVar6 <= (int)uVar8)) goto LAB_005cc0e2;
        ppvVar4 = pVVar3->pArray;
        iVar6 = Fra_NodesAreClause(p,(Aig_Obj_t *)ppvVar4[uVar5],(Aig_Obj_t *)ppvVar4[uVar8],
                                   uVar1 >> 0x1f,uVar2 >> 0x1f);
        if (iVar6 != 1) {
          p->pCla->fRefinement = 1;
          if (iVar6 == 0) {
            Fra_SmlResimulate(p);
          }
          if (vOneHots->nSize <= lVar9) {
LAB_005cc101:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (vOneHots->pArray[lVar9] != 0) {
            puts("Fra_OneHotCheck(): Clause is not refined!");
          }
          if (vOneHots->nSize <= lVar9) goto LAB_005cc101;
          if (vOneHots->pArray[lVar9] != 0) {
            __assert_fail("Vec_IntEntry(vOneHots, i) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraHot.c"
                          ,0xfa,"void Fra_OneHotCheck(Fra_Man_t *, Vec_Int_t *)");
          }
        }
      }
      lVar9 = lVar9 + 2;
      iVar6 = vOneHots->nSize;
    } while ((int)lVar9 < iVar6);
  }
  return;
}

Assistant:

void Fra_OneHotCheck( Fra_Man_t * p, Vec_Int_t * vOneHots )
{
    Aig_Obj_t * pObj1, * pObj2;
    int RetValue, i, Out1, Out2;
    int nTruePos = Aig_ManCoNum(p->pManFraig) - Aig_ManRegNum(p->pManFraig);
    for ( i = 0; i < Vec_IntSize(vOneHots); i += 2 )
    {
        Out1 = Vec_IntEntry( vOneHots, i );
        Out2 = Vec_IntEntry( vOneHots, i+1 );
        if ( Out1 == 0 && Out2 == 0 )
            continue;
        pObj1 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out1) );
        pObj2 = Aig_ManCo( p->pManFraig, nTruePos + Fra_LitReg(Out2) );
        RetValue = Fra_NodesAreClause( p, pObj1, pObj2, Fra_LitSign(Out1), Fra_LitSign(Out2) );
        if ( RetValue != 1 )
        {
            p->pCla->fRefinement = 1;
            if ( RetValue == 0 )
                Fra_SmlResimulate( p );
            if ( Vec_IntEntry(vOneHots, i) != 0 )
                printf( "Fra_OneHotCheck(): Clause is not refined!\n" );
            assert( Vec_IntEntry(vOneHots, i) == 0 );
        }
    }
}